

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_solve_seq.c
# Opt level: O3

void LP_dgefa(double *a,int lda,int n,int *ipvt,int *info)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  double dVar22;
  double dVar23;
  
  *info = 0;
  uVar4 = n - 1;
  if (1 < n) {
    lVar6 = (long)lda;
    uVar8 = (ulong)(uint)n;
    lVar1 = lVar6 * 8;
    uVar20 = 1;
    iVar21 = 0;
    uVar17 = 0;
    uVar9 = uVar8;
    pdVar10 = a;
    lVar18 = lVar1;
    lVar19 = lVar1;
    do {
      lVar15 = uVar17 * lVar6;
      iVar16 = (int)uVar17;
      lVar11 = (long)(iVar16 * lda);
      if ((long)uVar17 < (long)uVar8) {
        iVar5 = 0;
        if (uVar8 - uVar17 != 1) {
          dVar22 = ABS(a[uVar17 + lVar11]);
          uVar12 = 0;
          uVar13 = 1;
          do {
            dVar23 = ABS(pdVar10[(long)iVar21 + uVar13]);
            if (dVar22 < dVar23) {
              uVar12 = uVar13 & 0xffffffff;
            }
            iVar5 = (int)uVar12;
            if (dVar23 <= dVar22) {
              dVar23 = dVar22;
            }
            dVar22 = dVar23;
            uVar13 = uVar13 + 1;
          } while (uVar9 != uVar13);
        }
        ipvt[uVar17] = iVar5 + iVar16;
        lVar7 = (long)(iVar5 + iVar16);
        dVar22 = a[lVar15 + lVar7];
        if ((dVar22 == 0.0) && (!NAN(dVar22))) goto LAB_00196f5f;
        if (iVar5 != 0) goto LAB_00196f4d;
        bVar3 = true;
LAB_00196f6b:
        lVar11 = lVar18 + lVar7 * 8;
        uVar12 = uVar8;
        pdVar14 = a;
        do {
          if (!bVar3) {
            uVar2 = *(undefined8 *)((long)pdVar14 + lVar11);
            *(undefined8 *)((long)pdVar14 + lVar11) = *(undefined8 *)((long)pdVar14 + lVar19);
            *(undefined8 *)((long)pdVar14 + lVar19) = uVar2;
          }
          pdVar14 = pdVar14 + lVar6;
          uVar12 = uVar12 - 1;
        } while (uVar20 != uVar12);
      }
      else {
        ipvt[uVar17] = iVar16 + -1;
        dVar22 = a[lVar15 + (long)iVar16 + -1];
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          lVar7 = (long)iVar16 + -1;
LAB_00196f4d:
          a[lVar15 + lVar7] = a[uVar17 + lVar11];
          a[uVar17 + lVar11] = dVar22;
          bVar3 = false;
          goto LAB_00196f6b;
        }
LAB_00196f5f:
        *info = iVar16;
      }
      uVar17 = uVar17 + 1;
      uVar20 = uVar20 + 1;
      uVar9 = uVar9 - 1;
      pdVar10 = pdVar10 + 1;
      iVar21 = iVar21 + lda;
      lVar19 = lVar19 + lVar6 * 8 + 8;
      lVar18 = lVar18 + lVar1;
    } while (uVar17 != uVar4);
  }
  ipvt[(int)uVar4] = uVar4;
  if ((a[(int)((lda + 1) * uVar4)] == 0.0) && (!NAN(a[(int)((lda + 1) * uVar4)]))) {
    *info = uVar4;
  }
  return;
}

Assistant:

void LP_dgefa(a,lda,n,ipvt,info)
REAL a[];
int lda,n,ipvt[],*info;

/* We would like to declare a[][lda], but c does not allow it.  In this
function, references to a[i][j] are written a[lda*i+j].  */
/*
     LP_dgefa factors a double precision matrix by gaussian elimination.

     LP_dgefa is usually called by dgeco, but it can be called
     directly with a saving in time if  rcond  is not needed.
     (time for dgeco) = (1 + 9/n)*(time for LP_dgefa) .

     on entry

        a       REAL precision[n][lda]
                the matrix to be factored.

        lda     integer
                the leading dimension of the array  a .

        n       integer
                the order of the matrix  a .

     on return

        a       an upper triangular matrix and the multipliers
                which were used to obtain it.
                the factorization can be written  a = l*u  where
                l  is a product of permutation and unit lower
                triangular matrices and  u  is upper triangular.

        ipvt    integer[n]
                an integer vector of pivot indices.

        info    integer
                = 0  normal value.
                = k  if  u[k][k] .eq. 0.0 .  this is not an error
                     condition for this subroutine, but it does
                     indicate that LP_dgesl or dgedi will divide by zero
                     if called.  use  rcond  in dgeco for a reliable
                     indication of singularity.

     linpack. this version dated 08/14/78 .
     cleve moler, university of new mexico, argonne national lab.

     functions

     blas LP_daxpy,LP_dscal,LP_idamax
*/

{
/*     internal variables	*/

  REAL t;
  int j,k,kp1,l,nm1;


/*     gaussian elimination with partial pivoting	*/
	*info = 0;
	nm1 = n - 1;
	if (nm1 >=  0) {
		for (k = 0; k < nm1; k++) {
			kp1 = k + 1;

          		/* find l = pivot index	*/

			l = LP_idamax(n-k,&a[lda*k+k],1) + k;
			ipvt[k] = l;

			/* zero pivot implies this column already 
			   triangularized */
			if (a[lda*k+l] != ZERO) {

				/* interchange if necessary */

				if (l != k) {
					t = a[lda*k+l];
					a[lda*k+l] = a[lda*k+k];
					a[lda*k+k] = t; 
				}

				/* compute multipliers */

				t = -ONE/a[lda*k+k];
				LP_dscal(n-(k+1),t,&a[lda*k+k+1],1);

				/* row elimination with column indexing */

				for (j = kp1; j < n; j++) {
					t = a[lda*j+l];
					if (l != k) {
						a[lda*j+l] = a[lda*j+k];
						a[lda*j+k] = t;
					}
					LP_daxpy(n-(k+1),t,&a[lda*k+k+1],1,
					      &a[lda*j+k+1],1);
  				} 
  			}
			else { 
            			*info = k;
			}
		} 
	}
	ipvt[n-1] = n-1;
	if (a[lda*(n-1)+(n-1)] == ZERO) *info = n-1;
}